

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O0

void __thiscall
MeshDenoisingViaL0Minimization::calculateAreaBasedEdgeOperator
          (MeshDenoisingViaL0Minimization *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *area_based_edge_operator,
          vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
          *edge_vertex_handle,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *coef)

{
  allocator<double> *this_00;
  allocator<OpenMesh::VertexHandle> *this_01;
  double dVar1;
  double dVar2;
  pointer this_02;
  bool bVar3;
  int iVar4;
  HalfedgeHandle _heh;
  VertexHandle _vh;
  VertexHandle _vh_00;
  HalfedgeHandle HVar5;
  VertexHandle _vh_01;
  HalfedgeHandle _heh_00;
  VertexHandle _vh_02;
  int iVar6;
  size_type sVar7;
  reference pvVar8;
  BaseHandle *this_03;
  reference pvVar9;
  Point *pPVar10;
  reference this_04;
  reference pvVar11;
  reference this_05;
  reference pvVar12;
  Scalar SVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  EdgeIter EVar17;
  vector_type local_300;
  vector_type local_2e8;
  vector_type local_2d0;
  vector_type local_2b8;
  vector_type local_2a0;
  vector_type local_288;
  undefined1 local_270 [8];
  Point pt;
  Point p34;
  Point p23;
  Point p14;
  Point p13;
  Point p12;
  undefined1 auStack_1d8 [8];
  Point p4;
  undefined1 auStack_1b8 [8];
  Point p3;
  undefined1 auStack_198 [8];
  Point p2;
  undefined1 auStack_178 [8];
  Point p1;
  double totalArea;
  double area123;
  double area134;
  BaseHandle local_138;
  BaseHandle local_134;
  FaceHandle f2;
  FaceHandle f1;
  VertexHandle v2;
  HalfedgeHandle he_oppo_next;
  HalfedgeHandle he_oppo;
  VertexHandle v4;
  HalfedgeHandle he_next;
  VertexHandle v3;
  VertexHandle v1;
  HalfedgeHandle he;
  double edge_length;
  int index;
  value_handle local_d0;
  uint uStack_cc;
  undefined1 local_c8 [8];
  EdgeIter e_it;
  undefined1 local_b0 [8];
  vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> vertex_handle;
  value_type_conflict1 local_90;
  undefined1 local_88 [8];
  vector<double,_std::allocator<double>_> temp_coef;
  undefined1 local_48 [8];
  vector<double,_std::allocator<double>_> face_area;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *coef_local;
  vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
  *edge_vertex_handle_local;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  *area_based_edge_operator_local;
  TriMesh *mesh_local;
  MeshDenoisingViaL0Minimization *this_local;
  
  face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)coef;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_48);
  MeshDenoisingBase::getFaceArea
            (&this->super_MeshDenoisingBase,mesh,(vector<double,_std::allocator<double>_> *)local_48
            );
  iVar4 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x20))();
  OpenMesh::VectorT<double,_3>::VectorT
            ((VectorT<double,_3> *)
             &temp_coef.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0.0,0.0,0.0);
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (area_based_edge_operator,(long)iVar4,
             (value_type *)
             &temp_coef.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_90 = 0.0;
  this_00 = (allocator<double> *)
            ((long)&vertex_handle.
                    super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(this_00);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_88,4,&local_90,this_00);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&vertex_handle.
                     super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  this_02 = face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  sVar7 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x20))();
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)this_02,sVar7,(value_type *)local_88);
  this_01 = (allocator<OpenMesh::VertexHandle> *)((long)&e_it.skip_bits_ + 3);
  std::allocator<OpenMesh::VertexHandle>::allocator(this_01);
  std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::vector
            ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)local_b0,4,
             this_01);
  std::allocator<OpenMesh::VertexHandle>::~allocator
            ((allocator<OpenMesh::VertexHandle> *)((long)&e_it.skip_bits_ + 3));
  sVar7 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x20))();
  std::
  vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
  ::resize(edge_vertex_handle,sVar7,(value_type *)local_b0);
  EVar17 = OpenMesh::PolyConnectivity::edges_begin((PolyConnectivity *)mesh);
  while( true ) {
    e_it.mesh_ = EVar17._8_8_;
    local_c8 = (undefined1  [8])EVar17.mesh_;
    EVar17 = OpenMesh::PolyConnectivity::edges_end((PolyConnectivity *)mesh);
    _index = EVar17;
    bVar3 = OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
            ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                          *)local_c8,
                         (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                          *)&index);
    if (!bVar3) break;
    pvVar8 = OpenMesh::Iterators::
             GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
             ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                          *)local_c8);
    bVar3 = OpenMesh::PolyConnectivity::is_boundary
                      ((PolyConnectivity *)mesh,(EdgeHandle)(pvVar8->super_BaseHandle).idx_);
    if (!bVar3) {
      this_03 = &OpenMesh::Iterators::
                 GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                 ::operator->((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                               *)local_c8)->super_BaseHandle;
      iVar4 = OpenMesh::BaseHandle::idx(this_03);
      pvVar8 = OpenMesh::Iterators::
               GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
               ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                            *)local_c8);
      SVar13 = OpenMesh::
               PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
               ::calc_edge_length((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                   *)mesh,(EdgeHandle)(pvVar8->super_BaseHandle).idx_);
      pvVar8 = OpenMesh::Iterators::
               GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
               ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                            *)local_c8);
      _heh = OpenMesh::ArrayKernel::halfedge_handle
                       ((ArrayKernel *)mesh,(EdgeHandle)(pvVar8->super_BaseHandle).idx_,0);
      _vh = OpenMesh::ArrayKernel::from_vertex_handle((ArrayKernel *)mesh,_heh);
      _vh_00 = OpenMesh::ArrayKernel::to_vertex_handle((ArrayKernel *)mesh,_heh);
      HVar5 = OpenMesh::ArrayKernel::next_halfedge_handle((ArrayKernel *)mesh,_heh);
      _vh_01 = OpenMesh::ArrayKernel::to_vertex_handle((ArrayKernel *)mesh,HVar5);
      HVar5 = OpenMesh::ArrayKernel::opposite_halfedge_handle((ArrayKernel *)mesh,_heh);
      _heh_00 = OpenMesh::ArrayKernel::next_halfedge_handle((ArrayKernel *)mesh,HVar5);
      _vh_02 = OpenMesh::ArrayKernel::to_vertex_handle((ArrayKernel *)mesh,_heh_00);
      local_134 = _heh.super_BaseHandle.idx_;
      f2.super_BaseHandle.idx_ =
           (BaseHandle)OpenMesh::ArrayKernel::face_handle((ArrayKernel *)mesh,_heh);
      local_138.idx_ = (int)OpenMesh::ArrayKernel::face_handle((ArrayKernel *)mesh,HVar5);
      iVar6 = OpenMesh::BaseHandle::idx(&f2.super_BaseHandle);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_48,(long)iVar6);
      dVar1 = *pvVar9;
      iVar6 = OpenMesh::BaseHandle::idx(&local_138);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_48,(long)iVar6);
      dVar2 = *pvVar9;
      dVar14 = dVar2 + dVar1;
      p2.super_VectorDataT<double,_3>.values_[2]._4_4_ = _vh.super_BaseHandle.idx_;
      pPVar10 = OpenMesh::
                AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                         *)mesh,(VertexHandle)_vh.super_BaseHandle.idx_);
      p1.super_VectorDataT<double,_3>.values_[1] =
           (pPVar10->super_VectorDataT<double,_3>).values_[2];
      auStack_178 = (undefined1  [8])(pPVar10->super_VectorDataT<double,_3>).values_[0];
      p1.super_VectorDataT<double,_3>.values_[0] =
           (pPVar10->super_VectorDataT<double,_3>).values_[1];
      p3.super_VectorDataT<double,_3>.values_[2]._4_4_ = _vh_02.super_BaseHandle.idx_;
      pPVar10 = OpenMesh::
                AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                         *)mesh,(VertexHandle)_vh_02.super_BaseHandle.idx_);
      p2.super_VectorDataT<double,_3>.values_[1] =
           (pPVar10->super_VectorDataT<double,_3>).values_[2];
      auStack_198 = (undefined1  [8])(pPVar10->super_VectorDataT<double,_3>).values_[0];
      p2.super_VectorDataT<double,_3>.values_[0] =
           (pPVar10->super_VectorDataT<double,_3>).values_[1];
      p4.super_VectorDataT<double,_3>.values_[2]._4_4_ = _vh_00.super_BaseHandle.idx_;
      pPVar10 = OpenMesh::
                AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                         *)mesh,(VertexHandle)_vh_00.super_BaseHandle.idx_);
      p3.super_VectorDataT<double,_3>.values_[1] =
           (pPVar10->super_VectorDataT<double,_3>).values_[2];
      auStack_1b8 = (undefined1  [8])(pPVar10->super_VectorDataT<double,_3>).values_[0];
      p3.super_VectorDataT<double,_3>.values_[0] =
           (pPVar10->super_VectorDataT<double,_3>).values_[1];
      pPVar10 = OpenMesh::
                AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                         *)mesh,(VertexHandle)_vh_01.super_BaseHandle.idx_);
      p4.super_VectorDataT<double,_3>.values_[1] =
           (pPVar10->super_VectorDataT<double,_3>).values_[2];
      auStack_1d8 = (undefined1  [8])(pPVar10->super_VectorDataT<double,_3>).values_[0];
      p4.super_VectorDataT<double,_3>.values_[0] =
           (pPVar10->super_VectorDataT<double,_3>).values_[1];
      OpenMesh::VectorT<double,_3>::operator-
                ((vector_type *)(p13.super_VectorDataT<double,_3>.values_ + 2),
                 (VectorT<double,_3> *)auStack_178,(vector_type *)auStack_198);
      OpenMesh::VectorT<double,_3>::operator-
                ((vector_type *)(p14.super_VectorDataT<double,_3>.values_ + 2),
                 (VectorT<double,_3> *)auStack_178,(vector_type *)auStack_1b8);
      OpenMesh::VectorT<double,_3>::operator-
                ((vector_type *)(p23.super_VectorDataT<double,_3>.values_ + 2),
                 (VectorT<double,_3> *)auStack_178,(vector_type *)auStack_1d8);
      OpenMesh::VectorT<double,_3>::operator-
                ((vector_type *)(p34.super_VectorDataT<double,_3>.values_ + 2),
                 (VectorT<double,_3> *)auStack_198,(vector_type *)auStack_1b8);
      OpenMesh::VectorT<double,_3>::operator-
                ((vector_type *)(pt.super_VectorDataT<double,_3>.values_ + 2),
                 (VectorT<double,_3> *)auStack_1b8,(vector_type *)auStack_1d8);
      dVar15 = OpenMesh::VectorT<double,_3>::operator|
                         ((VectorT<double,_3> *)(pt.super_VectorDataT<double,_3>.values_ + 2),
                          (vector_type *)(p14.super_VectorDataT<double,_3>.values_ + 2));
      dVar16 = OpenMesh::VectorT<double,_3>::operator|
                         ((VectorT<double,_3> *)(p14.super_VectorDataT<double,_3>.values_ + 2),
                          (vector_type *)(p34.super_VectorDataT<double,_3>.values_ + 2));
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_88,0);
      *pvVar9 = (dVar2 * dVar15 - dVar1 * dVar16) / (SVar13 * SVar13 * dVar14);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_88,1);
      *pvVar9 = dVar1 / dVar14;
      dVar15 = OpenMesh::VectorT<double,_3>::operator|
                         ((VectorT<double,_3> *)(p14.super_VectorDataT<double,_3>.values_ + 2),
                          (vector_type *)(p23.super_VectorDataT<double,_3>.values_ + 2));
      dVar16 = OpenMesh::VectorT<double,_3>::operator|
                         ((VectorT<double,_3> *)(p13.super_VectorDataT<double,_3>.values_ + 2),
                          (vector_type *)(p14.super_VectorDataT<double,_3>.values_ + 2));
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_88,2);
      *pvVar9 = (-dVar2 * dVar15 - dVar1 * dVar16) / (SVar13 * SVar13 * dVar14);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_88,3);
      *pvVar9 = dVar2 / dVar14;
      this_04 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)face_area.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar4);
      std::vector<double,_std::allocator<double>_>::operator=
                (this_04,(vector<double,_std::allocator<double>_> *)local_88);
      pvVar11 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
                operator[]((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                            *)local_b0,0);
      (pvVar11->super_BaseHandle).idx_ = (int)_vh.super_BaseHandle.idx_;
      pvVar11 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
                operator[]((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                            *)local_b0,1);
      (pvVar11->super_BaseHandle).idx_ = (int)_vh_02.super_BaseHandle.idx_;
      pvVar11 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
                operator[]((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                            *)local_b0,2);
      (pvVar11->super_BaseHandle).idx_ = (int)_vh_00.super_BaseHandle.idx_;
      pvVar11 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
                operator[]((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                            *)local_b0,3);
      (pvVar11->super_BaseHandle).idx_ = (int)_vh_01.super_BaseHandle.idx_;
      this_05 = std::
                vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                ::operator[](edge_vertex_handle,(long)iVar4);
      std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::operator=
                (this_05,(vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                         local_b0);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_88,0);
      OpenMesh::VectorT<double,_3>::operator*(&local_2b8,(VectorT<double,_3> *)auStack_178,pvVar9);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_88,1);
      OpenMesh::VectorT<double,_3>::operator*(&local_2d0,(VectorT<double,_3> *)auStack_198,pvVar9);
      OpenMesh::VectorT<double,_3>::operator+(&local_2a0,&local_2b8,&local_2d0);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_88,2);
      OpenMesh::VectorT<double,_3>::operator*(&local_2e8,(VectorT<double,_3> *)auStack_1b8,pvVar9);
      OpenMesh::VectorT<double,_3>::operator+(&local_288,&local_2a0,&local_2e8);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_88,3);
      OpenMesh::VectorT<double,_3>::operator*(&local_300,(VectorT<double,_3> *)auStack_1d8,pvVar9);
      OpenMesh::VectorT<double,_3>::operator+((vector_type *)local_270,&local_288,&local_300);
      pvVar12 = std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::operator[](area_based_edge_operator,(long)iVar4);
      (pvVar12->super_VectorDataT<double,_3>).values_[0] = (double)local_270;
      (pvVar12->super_VectorDataT<double,_3>).values_[1] =
           pt.super_VectorDataT<double,_3>.values_[0];
      (pvVar12->super_VectorDataT<double,_3>).values_[2] =
           pt.super_VectorDataT<double,_3>.values_[1];
    }
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                  *)local_c8,0);
    EVar17._8_8_ = e_it.mesh_;
    EVar17.mesh_ = (mesh_ptr)local_c8;
  }
  std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::~vector
            ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)local_b0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_88);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_48);
  return;
}

Assistant:

void MeshDenoisingViaL0Minimization::calculateAreaBasedEdgeOperator(TriMesh &mesh,
                                                                    std::vector<TriMesh::Point> &area_based_edge_operator,
                                                                    std::vector< std::vector<TriMesh::VertexHandle> > &edge_vertex_handle,
                                                                    std::vector< std::vector<double> > &coef)
{
    std::vector<double> face_area;
    getFaceArea(mesh, face_area);

    area_based_edge_operator.resize((int)mesh.n_edges(), TriMesh::Point(0.0, 0.0, 0.0));
    std::vector<double> temp_coef(4, 0.0);
    coef.resize(mesh.n_edges(), temp_coef);
    std::vector<TriMesh::VertexHandle> vertex_handle(4);
    edge_vertex_handle.resize(mesh.n_edges(), vertex_handle);
    for(TriMesh::EdgeIter e_it = mesh.edges_begin(); e_it != mesh.edges_end(); e_it++)
    {
        if(!mesh.is_boundary(*e_it))
        {
            int index = e_it->idx();
            double edge_length = mesh.calc_edge_length(*e_it);

            // get four vertices correspond to edge *e_it
            TriMesh::HalfedgeHandle he = mesh.halfedge_handle(*e_it, 0);
            TriMesh::VertexHandle v1 = mesh.from_vertex_handle(he);
            TriMesh::VertexHandle v3 = mesh.to_vertex_handle(he);
            TriMesh::HalfedgeHandle he_next = mesh.next_halfedge_handle(he);
            TriMesh::VertexHandle v4 = mesh.to_vertex_handle(he_next);

            TriMesh::HalfedgeHandle he_oppo = mesh.opposite_halfedge_handle(he);
            TriMesh::HalfedgeHandle he_oppo_next = mesh.next_halfedge_handle(he_oppo);
            TriMesh::VertexHandle v2 = mesh.to_vertex_handle(he_oppo_next);

            // two faces
            TriMesh::FaceHandle f1 = mesh.face_handle(he);
            TriMesh::FaceHandle f2 = mesh.face_handle(he_oppo);

            // the area of two faces correspond to edge *e_it
            double area134 = face_area[f1.idx()];
            double area123 = face_area[f2.idx()];
            double totalArea = area123 + area134;

            TriMesh::Point p1 = mesh.point(v1);
            TriMesh::Point p2 = mesh.point(v2);
            TriMesh::Point p3 = mesh.point(v3);
            TriMesh::Point p4 = mesh.point(v4);

            TriMesh::Point p12 = p1 - p2;
            TriMesh::Point p13 = p1 - p3;
            TriMesh::Point p14 = p1 - p4;
            TriMesh::Point p23 = p2 - p3;
            TriMesh::Point p34 = p3 - p4;

            // calc coefficient
            temp_coef[0] = (area123 * (p34 | p13) - area134 * (p13 | p23)) / (edge_length * edge_length * totalArea);
            temp_coef[1] = area134 / totalArea;
            temp_coef[2] = (-area123 * (p13 | p14) - area134 * (p12 | p13)) / (edge_length * edge_length * totalArea);
            temp_coef[3] = area123 / totalArea;
            coef[index] = temp_coef;

            vertex_handle[0] = v1;
            vertex_handle[1] = v2;
            vertex_handle[2] = v3;
            vertex_handle[3] = v4;
            edge_vertex_handle[index] = vertex_handle;

            // calc area-based edge operator
            TriMesh::Point pt = p1 * temp_coef[0] + p2 * temp_coef[1] + p3 * temp_coef[2] + p4 * temp_coef[3];
            area_based_edge_operator[index] = pt;
        }
    }
}